

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

Logon * anon_unknown.dwarf_334836::createT11Logon
                  (Logon *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  allocator<char> local_a1;
  FieldBase local_a0;
  STRING local_48;
  
  FIXT11::Logon::Logon(__return_storage_ptr__);
  FIX::EncryptMethod::EncryptMethod((EncryptMethod *)&local_a0,0);
  FIXT11::Logon::set(__return_storage_ptr__,(EncryptMethod *)&local_a0);
  FIX::FieldBase::~FieldBase(&local_a0);
  FIX::HeartBtInt::HeartBtInt((HeartBtInt *)&local_a0,0x1e);
  FIXT11::Logon::set(__return_storage_ptr__,(HeartBtInt *)&local_a0);
  FIX::FieldBase::~FieldBase(&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"7",&local_a1);
  FIX::DefaultApplVerID::DefaultApplVerID((DefaultApplVerID *)&local_a0,&local_48);
  FIXT11::Logon::set(__return_storage_ptr__,(DefaultApplVerID *)&local_a0);
  FIX::FieldBase::~FieldBase(&local_a0);
  std::__cxx11::string::~string((string *)&local_48);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,sender,target,seq);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_a0,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_a0,true);
  FIX::FieldBase::~FieldBase(&local_a0);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_a0,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_a0,true);
  FIX::FieldBase::~FieldBase(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

FIXT11::Logon createT11Logon(const char *sender, const char *target, int seq) {
  FIXT11::Logon logon;
  logon.set(EncryptMethod(0));
  logon.set(HeartBtInt(30));
  logon.set(DefaultApplVerID("7"));
  fillHeader(logon.getHeader(), sender, target, seq);
  logon.getHeader().setField(BodyLength(logon.bodyLength()));
  logon.getTrailer().setField(CheckSum(logon.checkSum()));
  return logon;
}